

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall Imf_3_3::InputFile::InputFile(InputFile *this,char *filename,int numThreads)

{
  ContextInitializer *in_RDI;
  undefined1 in_stack_ffffffffffffff5f;
  undefined1 local_90 [60];
  int in_stack_ffffffffffffffac;
  ContextInitializer *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  InputFile *in_stack_ffffffffffffffc0;
  
  memset(local_90,0,0x78);
  ContextInitializer::ContextInitializer((ContextInitializer *)local_90);
  ContextInitializer::silentHeaderParse(in_RDI,(bool)in_stack_ffffffffffffff5f);
  ContextInitializer::strictHeaderValidation(in_RDI,(bool)in_stack_ffffffffffffff5f);
  InputFile(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
            in_stack_ffffffffffffffac);
  return;
}

Assistant:

InputFile::InputFile (const char filename[], int numThreads)
    : InputFile (filename,
                 ContextInitializer ()
                 .silentHeaderParse (true)
                 .strictHeaderValidation (false),
                 numThreads)
{}